

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  ImVec1 IVar1;
  ImVec2 local_28;
  ImGuiGroupData *local_20;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  group_data = (ImGuiGroupData *)GImGui->CurrentWindow;
  ImVector<ImGuiGroupData>::resize
            (&(((ImGuiWindow *)group_data)->DC).GroupStack,
             (((ImGuiWindow *)group_data)->DC).GroupStack.Size + 1);
  local_20 = ImVector<ImGuiGroupData>::back
                       ((ImVector<ImGuiGroupData> *)&group_data[0xd].BackupCursorPos.y);
  IVar1.x = group_data[6].BackupGroupOffset.x;
  (local_20->BackupCursorPos).x = group_data[6].BackupIndent.x;
  (local_20->BackupCursorPos).y = IVar1.x;
  local_20->BackupCursorMaxPos = *(ImVec2 *)&group_data[6].BackupActiveIdPreviousFrameIsAlive;
  (local_20->BackupIndent).x = group_data[7].BackupCurrLineSize.y;
  (local_20->BackupGroupOffset).x = (float)group_data[7].BackupActiveIdIsAlive;
  local_20->BackupCurrLineSize = *(ImVec2 *)&group_data[7].BackupCursorPos.y;
  local_20->BackupCurrLineTextBaseOffset = group_data[7].BackupGroupOffset.x;
  local_20->BackupActiveIdIsAlive = (ImGuiID)window[6].SizeFull.y;
  local_20->BackupActiveIdPreviousFrameIsAlive = (bool)(*(byte *)&window[6].ScrollTarget.x & 1);
  local_20->EmitItem = true;
  group_data[7].BackupActiveIdIsAlive =
       (ImGuiID)((group_data[6].BackupIndent.x - group_data[1].BackupCurrLineSize.y) -
                group_data[7].BackupCurrLineTextBaseOffset);
  group_data[7].BackupCurrLineSize.y = (float)group_data[7].BackupActiveIdIsAlive;
  *(undefined8 *)&group_data[6].BackupActiveIdPreviousFrameIsAlive =
       *(undefined8 *)&group_data[6].BackupIndent;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  *(ImVec2 *)&group_data[7].BackupCursorPos.y = local_28;
  if ((window[10].DC.ItemFlagsStack.Size & 1) != 0) {
    window[10].DC.TextWrapPosStack.Size = -0x800001;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return
}